

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O0

NLW2_SOLReadResultCode __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::gsufread(SOLReader2<mp::SOLHandler_Easy> *this,FILE *f)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  FILE *in_RSI;
  SOLReader2<mp::SOLHandler_Easy> *in_RDI;
  SuffixReader<int> sr_1;
  SuffixReader<double> sr;
  SuffixInfo si;
  int i;
  SufRead SR;
  char buf [512];
  size_t L;
  char *se;
  char *s;
  SuffixReader<double> *in_stack_fffffffffffff998;
  undefined7 in_stack_fffffffffffff9a0;
  undefined1 in_stack_fffffffffffff9a7;
  SOLReader2<mp::SOLHandler_Easy> *in_stack_fffffffffffff9a8;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  SuffixInfo *in_stack_fffffffffffff9b8;
  SuffixReader<double> *this_00;
  undefined4 in_stack_fffffffffffff9d0;
  uint in_stack_fffffffffffff9d4;
  char *in_stack_fffffffffffff9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e0;
  undefined1 local_588 [448];
  string local_3c8 [111];
  allocator<char> local_359;
  string local_358 [32];
  int local_338;
  allocator<char> local_331;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [32];
  uint local_2c0;
  allocator<char> local_2a9;
  string local_2a8 [40];
  uint local_280;
  int local_27c;
  int local_278;
  int local_274;
  char *local_270;
  SuffixReader<double> *local_260;
  int local_240;
  char acStack_23a [9];
  SuffixReader<double> local_231 [4];
  size_t local_30;
  long local_28;
  SuffixReader<double> *local_20;
  FILE *local_18;
  NLW2_SOLReadResultCode local_4;
  
  local_18 = in_RSI;
  do {
    pcVar2 = fgets(acStack_23a + 2,0x1ff,local_18);
    if (pcVar2 == (char *)0x0) {
      return NLW2_SOLRead_OK;
    }
    SufRead::SufRead((SufRead *)0x145c08);
    iVar1 = strncmp(acStack_23a + 2,"suffix ",7);
    if (iVar1 == 0) {
      local_20 = local_231;
      iVar1 = Lget((char **)&local_20,(int *)&local_280);
      if ((((iVar1 == 0) && (iVar1 = Lget((char **)&local_20,&local_27c), iVar1 == 0)) &&
          (iVar1 = Lget((char **)&local_20,&local_278), iVar1 == 0)) &&
         ((iVar1 = Lget((char **)&local_20,&local_274), iVar1 == 0 &&
          (iVar1 = Lget((char **)&local_20,&local_240), iVar1 == 0)))) {
        iVar1 = sufheadcheck(in_stack_fffffffffffff9a8,
                             (SufRead *)
                             CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0));
        if (iVar1 == 0) {
          pcVar2 = fgets(acStack_23a + 2,0x1ff,local_18);
          if ((pcVar2 == (char *)0x0) ||
             ((acStack_23a[(long)(local_278 + -1) + 2] != '\n' &&
              ((acStack_23a[(long)(local_278 + -1) + 2] != '\r' ||
               (acStack_23a[(long)local_278 + 2] != '\n')))))) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
            local_4 = ReportBadLine((SOLReader2<mp::SOLHandler_Easy> *)
                                    CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                                    (string *)in_stack_fffffffffffff9a8);
            std::__cxx11::string::~string(local_330);
            std::allocator<char>::~allocator(&local_331);
            local_2c0 = 1;
          }
          else {
            acStack_23a[(long)(local_278 + -1) + 2] = '\0';
            strcpy(local_270,acStack_23a + 2);
            if (local_274 == 0) {
LAB_00146433:
              in_stack_fffffffffffff9e0 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_588 + 0x1bf);
              in_stack_fffffffffffff9d4 = local_280;
              in_stack_fffffffffffff9d8 = local_270;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
              this_00 = local_260;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
              SuffixInfo::SuffixInfo
                        ((SuffixInfo *)this_00,(int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                         (string *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                         (string *)in_stack_fffffffffffff9a8);
              std::__cxx11::string::~string((string *)(local_588 + 0x198));
              std::allocator<char>::~allocator((allocator<char> *)(local_588 + 0x197));
              std::__cxx11::string::~string(local_3c8);
              std::allocator<char>::~allocator((allocator<char> *)(local_588 + 0x1bf));
              if ((local_280 & 4) == 0) {
                in_stack_fffffffffffff9a8 = (SOLReader2<mp::SOLHandler_Easy> *)local_588;
                SuffixInfo::SuffixInfo
                          ((SuffixInfo *)
                           CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                           (SuffixInfo *)in_stack_fffffffffffff998);
                SuffixReader<int>::SuffixReader
                          ((SuffixReader<int> *)this_00,in_stack_fffffffffffff9b8,
                           (FILE *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                           (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
                           (int)in_stack_fffffffffffff9a8);
                SuffixInfo::~SuffixInfo
                          ((SuffixInfo *)
                           CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0));
                Handler(in_RDI);
                SOLHandler_Easy::OnIntSuffix<mp::SuffixReader<int>>
                          ((SOLHandler_Easy *)
                           CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                           (SuffixReader<int> *)in_stack_fffffffffffff998);
                in_stack_fffffffffffff9a7 =
                     CheckReader<mp::SuffixReader<int>>
                               (in_stack_fffffffffffff9a8,
                                (SuffixReader<int> *)
                                CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                                (NLW2_SOLReadResultCode *)in_stack_fffffffffffff998);
                if (!(bool)in_stack_fffffffffffff9a7) {
                  local_4 = in_RDI->readresult_;
                }
                local_2c0 = (uint)!(bool)in_stack_fffffffffffff9a7;
                SuffixReader<int>::~SuffixReader
                          ((SuffixReader<int> *)
                           CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0));
              }
              else {
                in_stack_fffffffffffff9b8 = (SuffixInfo *)(local_588 + 200);
                SuffixInfo::SuffixInfo
                          ((SuffixInfo *)
                           CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                           (SuffixInfo *)in_stack_fffffffffffff998);
                SuffixReader<double>::SuffixReader
                          (this_00,in_stack_fffffffffffff9b8,
                           (FILE *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                           (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
                           (int)in_stack_fffffffffffff9a8);
                SuffixInfo::~SuffixInfo
                          ((SuffixInfo *)
                           CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0));
                Handler(in_RDI);
                SOLHandler_Easy::OnDblSuffix<mp::SuffixReader<double>>
                          ((SOLHandler_Easy *)
                           CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                           in_stack_fffffffffffff998);
                in_stack_fffffffffffff9b7 =
                     CheckReader<mp::SuffixReader<double>>
                               (in_stack_fffffffffffff9a8,
                                (SuffixReader<double> *)
                                CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                                (NLW2_SOLReadResultCode *)in_stack_fffffffffffff998);
                if (!(bool)in_stack_fffffffffffff9b7) {
                  local_4 = in_RDI->readresult_;
                }
                local_2c0 = (uint)!(bool)in_stack_fffffffffffff9b7;
                SuffixReader<double>::~SuffixReader
                          ((SuffixReader<double> *)
                           CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0));
              }
              if (local_2c0 == 0) {
                local_2c0 = 0;
              }
              SuffixInfo::~SuffixInfo
                        ((SuffixInfo *)CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0)
                        );
            }
            else {
              local_20 = local_260;
              local_28 = (long)&(local_260->super_SparseVecReader<double>).f_ + (long)local_274;
              for (local_338 = 1; local_338 < local_240; local_338 = local_338 + 1) {
                pcVar2 = fgets((char *)local_20,(int)local_28 - (int)local_20,local_18);
                if (pcVar2 == (char *)0x0) {
                  local_4 = ReportEarlyEof((SOLReader2<mp::SOLHandler_Easy> *)
                                           CONCAT17(in_stack_fffffffffffff9a7,
                                                    in_stack_fffffffffffff9a0));
                  local_2c0 = 1;
                  goto LAB_0014682c;
                }
                sVar3 = strlen((char *)local_20);
                local_20 = (SuffixReader<double> *)
                           ((long)&(local_20->super_SparseVecReader<double>).f_ + sVar3);
              }
              pcVar2 = fgets(acStack_23a + 2,0x1ff,local_18);
              if (pcVar2 == (char *)0x0) {
                local_4 = ReportEarlyEof((SOLReader2<mp::SOLHandler_Easy> *)
                                         CONCAT17(in_stack_fffffffffffff9a7,
                                                  in_stack_fffffffffffff9a0));
                local_2c0 = 1;
              }
              else {
                sVar3 = strlen(acStack_23a + 2);
                local_30 = sVar3;
                if (sVar3 != 0) {
                  local_30 = sVar3 - 1;
                  if ((acStack_23a[sVar3 + 1] == '\n') &&
                     (local_30 < (ulong)(local_28 - (long)local_20))) {
                    if ((local_30 != 0) &&
                       ((acStack_23a[sVar3] != '\r' || (local_30 = sVar3 - 2, local_30 != 0)))) {
                      acStack_23a[local_30 + 2] = '\0';
                      memcpy(local_20,acStack_23a + 2,local_30);
                    }
                    goto LAB_00146433;
                  }
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                           (allocator<char> *)
                           CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
                local_4 = ReportBadLine((SOLReader2<mp::SOLHandler_Easy> *)
                                        CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0
                                                ),(string *)in_stack_fffffffffffff9a8);
                std::__cxx11::string::~string(local_358);
                std::allocator<char>::~allocator(&local_359);
                local_2c0 = 1;
              }
            }
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
          local_4 = ReportBadLine((SOLReader2<mp::SOLHandler_Easy> *)
                                  CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                                  (string *)in_stack_fffffffffffff9a8);
          std::__cxx11::string::~string(local_308);
          std::allocator<char>::~allocator(&local_309);
          local_2c0 = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0))
        ;
        local_4 = ReportBadLine((SOLReader2<mp::SOLHandler_Easy> *)
                                CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                                (string *)in_stack_fffffffffffff9a8);
        std::__cxx11::string::~string(local_2e0);
        std::allocator<char>::~allocator(&local_2e1);
        local_2c0 = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      local_4 = ReportBadLine((SOLReader2<mp::SOLHandler_Easy> *)
                              CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                              (string *)in_stack_fffffffffffff9a8);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      local_2c0 = 1;
    }
LAB_0014682c:
    SufRead::~SufRead((SufRead *)0x146839);
    if (local_2c0 != 0) {
      return local_4;
    }
  } while( true );
}

Assistant:

NLW2_SOLReadResultCode SOLReader2<SOLHandler>::gsufread(FILE* f) {
  char *s, *se;
  size_t L;
  char buf[512];

  while(fgets(buf, sizeof(buf)-1, f)) {
    SufRead SR;
    if (strncmp(buf, "suffix ", 7))
      return ReportBadLine(buf);
    s = buf + 7;
    if (Lget(&s, &SR.h.kind)
        || Lget(&s, &SR.h.n)
        || Lget(&s, &SR.h.namelen)
        || Lget(&s, &SR.h.tablen)
        || Lget(&s, &SR.tablines))
      return ReportBadLine(buf);
    if (sufheadcheck(&SR))
      return ReportBadLine(buf);
    if (!fgets(buf, sizeof(buf)-1, f)
        || (buf[SR.h.namelen-1] != '\n'
            && (buf[SR.h.namelen-1] != '\r'
                || buf[SR.h.namelen] != '\n')))
      return ReportBadLine(buf);
    buf[SR.h.namelen-1] = 0;
    strcpy(SR.name, buf);
    if (SR.h.tablen) {
      s = SR.table;
      se = s + SR.h.tablen;
      for(int i = 1; i < SR.tablines; i++) {
        if (!fgets(s, se-s, f))
          return ReportEarlyEof();
        s += strlen(s);
      }
      if (!fgets(buf, sizeof(buf)-1, f))
        return ReportEarlyEof();
      if (!(L = strlen(buf)) || buf[--L] != '\n'
          || L >= (size_t)(se - s))
        return ReportBadLine(buf);
      if (L) {
        if (buf[L-1] != '\r' || --L) {
          buf[L] = 0;
          memcpy(s, buf, L);
        }
      }
    }
    SuffixInfo si(SR.h.kind, SR.name, SR.table);
    if (SR.h.kind & 4) {        // real-valued
      SuffixReader<double> sr(std::move(si), f, binary, SR.h.n);
      Handler().OnDblSuffix(sr);
      if (!CheckReader( sr, readresult_ ))
        return readresult_;
    } else {                    // int-valued
      SuffixReader<int> sr(std::move(si), f, binary, SR.h.n);
      Handler().OnIntSuffix(sr);
      if (!CheckReader( sr, readresult_ ))
        return readresult_;
    }
    //		sufput(&SR, ac, newsufs);
  }
  return NLW2_SOLRead_OK;
}